

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

char * ImTextCharToUtf8(char *out_buf,uint c)

{
  uint uVar1;
  
  uVar1 = ImTextCharToUtf8_inline(out_buf,5,c);
  out_buf[uVar1] = '\0';
  return out_buf;
}

Assistant:

const char* ImTextCharToUtf8(char out_buf[5], unsigned int c)
{
    int count = ImTextCharToUtf8_inline(out_buf, 5, c);
    out_buf[count] = 0;
    return out_buf;
}